

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O0

void av1_idct16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t *piVar6;
  long in_RCX;
  char in_DL;
  int32_t *in_RSI;
  int32_t *in_RDI;
  int32_t step [16];
  int32_t *bf1;
  int32_t *bf0;
  int32_t stage;
  int32_t *cospi;
  int32_t size;
  int32_t local_88;
  int32_t local_84;
  int32_t local_80;
  int32_t local_7c;
  int32_t local_78;
  int8_t iVar7;
  int32_t local_6c;
  
  piVar6 = cospi_arr((int)in_DL);
  *in_RSI = *in_RDI;
  in_RSI[1] = in_RDI[8];
  in_RSI[2] = in_RDI[4];
  in_RSI[3] = in_RDI[0xc];
  in_RSI[4] = in_RDI[2];
  in_RSI[5] = in_RDI[10];
  in_RSI[6] = in_RDI[6];
  in_RSI[7] = in_RDI[0xe];
  in_RSI[8] = in_RDI[1];
  in_RSI[9] = in_RDI[9];
  in_RSI[10] = in_RDI[5];
  in_RSI[0xb] = in_RDI[0xd];
  in_RSI[0xc] = in_RDI[3];
  in_RSI[0xd] = in_RDI[0xb];
  in_RSI[0xe] = in_RDI[7];
  in_RSI[0xf] = in_RDI[0xf];
  av1_range_check_buf(1,in_RDI,in_RSI,0x10,*(int8_t *)(in_RCX + 1));
  local_88 = *in_RSI;
  local_84 = in_RSI[1];
  local_80 = in_RSI[2];
  local_7c = in_RSI[3];
  local_78 = in_RSI[4];
  iVar3 = in_RSI[5];
  iVar4 = in_RSI[6];
  iVar2 = in_RSI[7];
  half_btf(piVar6[0x3c],in_RSI[8],-piVar6[4],in_RSI[0xf],(int)in_DL);
  half_btf(piVar6[0x1c],in_RSI[9],-piVar6[0x24],in_RSI[0xe],(int)in_DL);
  half_btf(piVar6[0x2c],in_RSI[10],-piVar6[0x14],in_RSI[0xd],(int)in_DL);
  half_btf(piVar6[0xc],in_RSI[0xb],-piVar6[0x34],in_RSI[0xc],(int)in_DL);
  half_btf(piVar6[0x34],in_RSI[0xb],piVar6[0xc],in_RSI[0xc],(int)in_DL);
  half_btf(piVar6[0x14],in_RSI[10],piVar6[0x2c],in_RSI[0xd],(int)in_DL);
  half_btf(piVar6[0x24],in_RSI[9],piVar6[0x1c],in_RSI[0xe],(int)in_DL);
  half_btf(piVar6[4],in_RSI[8],piVar6[0x3c],in_RSI[0xf],(int)in_DL);
  av1_range_check_buf(2,in_RDI,&local_88,0x10,*(int8_t *)(in_RCX + 2));
  *in_RSI = local_88;
  in_RSI[1] = local_84;
  in_RSI[2] = local_80;
  in_RSI[3] = local_7c;
  iVar1 = half_btf(piVar6[0x38],local_78,-piVar6[8],local_6c,(int)in_DL);
  in_RSI[4] = iVar1;
  iVar1 = half_btf(piVar6[0x18],iVar3,-piVar6[0x28],iVar4,(int)in_DL);
  in_RSI[5] = iVar1;
  iVar1 = half_btf(piVar6[0x28],iVar3,piVar6[0x18],iVar4,(int)in_DL);
  in_RSI[6] = iVar1;
  iVar2 = half_btf(piVar6[8],local_78,piVar6[0x38],iVar2,(int)in_DL);
  iVar7 = (int8_t)((uint)iVar3 >> 0x18);
  in_RSI[7] = iVar2;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[8] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[9] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[10] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[0xb] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[0xc] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[0xd] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[0xe] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[0xf] = iVar3;
  av1_range_check_buf(3,in_RDI,in_RSI,0x10,*(int8_t *)(in_RCX + 3));
  local_88 = half_btf(piVar6[0x20],*in_RSI,piVar6[0x20],in_RSI[1],(int)in_DL);
  half_btf(piVar6[0x20],*in_RSI,-piVar6[0x20],in_RSI[1],(int)in_DL);
  half_btf(piVar6[0x30],in_RSI[2],-piVar6[0x10],in_RSI[3],(int)in_DL);
  half_btf(piVar6[0x10],in_RSI[2],piVar6[0x30],in_RSI[3],(int)in_DL);
  iVar3 = clamp_value(iVar4,iVar7);
  iVar2 = clamp_value(iVar4,iVar7);
  iVar7 = (int8_t)((uint)iVar2 >> 0x18);
  iVar4 = clamp_value(iVar4,iVar7);
  iVar1 = clamp_value(iVar4,iVar7);
  half_btf(-piVar6[0x10],in_RSI[9],piVar6[0x30],in_RSI[0xe],(int)in_DL);
  half_btf(-piVar6[0x30],in_RSI[10],-piVar6[0x10],in_RSI[0xd],(int)in_DL);
  half_btf(-piVar6[0x10],in_RSI[10],piVar6[0x30],in_RSI[0xd],(int)in_DL);
  half_btf(piVar6[0x30],in_RSI[9],piVar6[0x10],in_RSI[0xe],(int)in_DL);
  av1_range_check_buf(4,in_RDI,&local_88,0x10,*(int8_t *)(in_RCX + 4));
  iVar5 = clamp_value(iVar4,iVar7);
  *in_RSI = iVar5;
  iVar5 = clamp_value(iVar4,iVar7);
  in_RSI[1] = iVar5;
  iVar5 = clamp_value(iVar4,iVar7);
  in_RSI[2] = iVar5;
  iVar5 = clamp_value(iVar4,iVar7);
  in_RSI[3] = iVar5;
  in_RSI[4] = iVar3;
  iVar3 = half_btf(-piVar6[0x20],iVar2,piVar6[0x20],iVar4,(int)in_DL);
  in_RSI[5] = iVar3;
  iVar3 = half_btf(piVar6[0x20],iVar2,piVar6[0x20],iVar4,(int)in_DL);
  in_RSI[6] = iVar3;
  in_RSI[7] = iVar1;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[8] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[9] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[10] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[0xb] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[0xc] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[0xd] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[0xe] = iVar3;
  iVar3 = clamp_value(iVar4,iVar7);
  in_RSI[0xf] = iVar3;
  av1_range_check_buf(5,in_RDI,in_RSI,0x10,*(int8_t *)(in_RCX + 5));
  local_88 = clamp_value(iVar4,iVar7);
  clamp_value(iVar4,iVar7);
  clamp_value(iVar4,iVar7);
  clamp_value(iVar4,iVar7);
  clamp_value(iVar4,iVar7);
  iVar3 = clamp_value(iVar4,iVar7);
  iVar7 = (int8_t)((uint)iVar3 >> 0x18);
  iVar3 = clamp_value(iVar4,iVar7);
  clamp_value(iVar3,iVar7);
  half_btf(-piVar6[0x20],in_RSI[10],piVar6[0x20],in_RSI[0xd],(int)in_DL);
  half_btf(-piVar6[0x20],in_RSI[0xb],piVar6[0x20],in_RSI[0xc],(int)in_DL);
  half_btf(piVar6[0x20],in_RSI[0xb],piVar6[0x20],in_RSI[0xc],(int)in_DL);
  half_btf(piVar6[0x20],in_RSI[10],piVar6[0x20],in_RSI[0xd],(int)in_DL);
  av1_range_check_buf(6,in_RDI,&local_88,0x10,*(int8_t *)(in_RCX + 6));
  iVar4 = clamp_value(iVar3,iVar7);
  *in_RSI = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[1] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[2] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[3] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[4] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[5] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[6] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[7] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[8] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[9] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[10] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[0xb] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[0xc] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[0xd] = iVar4;
  iVar4 = clamp_value(iVar3,iVar7);
  in_RSI[0xe] = iVar4;
  iVar3 = clamp_value(iVar3,iVar7);
  in_RSI[0xf] = iVar3;
  return;
}

Assistant:

void av1_idct16(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 16;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = input[8];
  bf1[2] = input[4];
  bf1[3] = input[12];
  bf1[4] = input[2];
  bf1[5] = input[10];
  bf1[6] = input[6];
  bf1[7] = input[14];
  bf1[8] = input[1];
  bf1[9] = input[9];
  bf1[10] = input[5];
  bf1[11] = input[13];
  bf1[12] = input[3];
  bf1[13] = input[11];
  bf1[14] = input[7];
  bf1[15] = input[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[60], bf0[8], -cospi[4], bf0[15], cos_bit);
  bf1[9] = half_btf(cospi[28], bf0[9], -cospi[36], bf0[14], cos_bit);
  bf1[10] = half_btf(cospi[44], bf0[10], -cospi[20], bf0[13], cos_bit);
  bf1[11] = half_btf(cospi[12], bf0[11], -cospi[52], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[52], bf0[11], cospi[12], bf0[12], cos_bit);
  bf1[13] = half_btf(cospi[20], bf0[10], cospi[44], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[36], bf0[9], cospi[28], bf0[14], cos_bit);
  bf1[15] = half_btf(cospi[4], bf0[8], cospi[60], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[56], bf0[4], -cospi[8], bf0[7], cos_bit);
  bf1[5] = half_btf(cospi[24], bf0[5], -cospi[40], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[40], bf0[5], cospi[24], bf0[6], cos_bit);
  bf1[7] = half_btf(cospi[8], bf0[4], cospi[56], bf0[7], cos_bit);
  bf1[8] = clamp_value(bf0[8] + bf0[9], stage_range[stage]);
  bf1[9] = clamp_value(bf0[8] - bf0[9], stage_range[stage]);
  bf1[10] = clamp_value(-bf0[10] + bf0[11], stage_range[stage]);
  bf1[11] = clamp_value(bf0[10] + bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[12] + bf0[13], stage_range[stage]);
  bf1[13] = clamp_value(bf0[12] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(-bf0[14] + bf0[15], stage_range[stage]);
  bf1[15] = clamp_value(bf0[14] + bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[32], bf0[0], -cospi[32], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], -cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[16], bf0[2], cospi[48], bf0[3], cos_bit);
  bf1[4] = clamp_value(bf0[4] + bf0[5], stage_range[stage]);
  bf1[5] = clamp_value(bf0[4] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(-bf0[6] + bf0[7], stage_range[stage]);
  bf1[7] = clamp_value(bf0[6] + bf0[7], stage_range[stage]);
  bf1[8] = bf0[8];
  bf1[9] = half_btf(-cospi[16], bf0[9], cospi[48], bf0[14], cos_bit);
  bf1[10] = half_btf(-cospi[48], bf0[10], -cospi[16], bf0[13], cos_bit);
  bf1[11] = bf0[11];
  bf1[12] = bf0[12];
  bf1[13] = half_btf(-cospi[16], bf0[10], cospi[48], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[48], bf0[9], cospi[16], bf0[14], cos_bit);
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[3], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[2], stage_range[stage]);
  bf1[2] = clamp_value(bf0[1] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[0] - bf0[3], stage_range[stage]);
  bf1[4] = bf0[4];
  bf1[5] = half_btf(-cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[7] = bf0[7];
  bf1[8] = clamp_value(bf0[8] + bf0[11], stage_range[stage]);
  bf1[9] = clamp_value(bf0[9] + bf0[10], stage_range[stage]);
  bf1[10] = clamp_value(bf0[9] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[8] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(-bf0[12] + bf0[15], stage_range[stage]);
  bf1[13] = clamp_value(-bf0[13] + bf0[14], stage_range[stage]);
  bf1[14] = clamp_value(bf0[13] + bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[12] + bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = clamp_value(bf0[0] + bf0[7], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[6], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[5], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[4], stage_range[stage]);
  bf1[4] = clamp_value(bf0[3] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[2] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[1] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[0] - bf0[7], stage_range[stage]);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(-cospi[32], bf0[10], cospi[32], bf0[13], cos_bit);
  bf1[11] = half_btf(-cospi[32], bf0[11], cospi[32], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[32], bf0[11], cospi[32], bf0[12], cos_bit);
  bf1[13] = half_btf(cospi[32], bf0[10], cospi[32], bf0[13], cos_bit);
  bf1[14] = bf0[14];
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[15], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[14], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[13], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[12], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[11], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[10], stage_range[stage]);
  bf1[6] = clamp_value(bf0[6] + bf0[9], stage_range[stage]);
  bf1[7] = clamp_value(bf0[7] + bf0[8], stage_range[stage]);
  bf1[8] = clamp_value(bf0[7] - bf0[8], stage_range[stage]);
  bf1[9] = clamp_value(bf0[6] - bf0[9], stage_range[stage]);
  bf1[10] = clamp_value(bf0[5] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[4] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[3] - bf0[12], stage_range[stage]);
  bf1[13] = clamp_value(bf0[2] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(bf0[1] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[0] - bf0[15], stage_range[stage]);
}